

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void __thiscall
randomx::SuperscalarInstruction::createForSlot
          (SuperscalarInstruction *this,Blake2Generator *gen,int slotSize,int fetchType,bool isLast,
          bool isFirst)

{
  undefined3 in_register_00000081;
  
  (*(code *)(&DAT_0012e180 + *(int *)(&DAT_0012e180 + (ulong)(slotSize - 3) * 4)))
            (this,gen,&DAT_0012e180 + *(int *)(&DAT_0012e180 + (ulong)(slotSize - 3) * 4),fetchType,
             CONCAT31(in_register_00000081,isLast));
  return;
}

Assistant:

void createForSlot(Blake2Generator& gen, int slotSize, int fetchType, bool isLast, bool isFirst) {
			switch (slotSize)
			{
			case 3:
				//if this is the last slot, we can also select "IMULH" instructions
				if (isLast) {
					create(slot_3L[gen.getByte() & 3], gen);
				}
				else {
					create(slot_3[gen.getByte() & 1], gen);
				}
				break;
			case 4:
				//if this is the 4-4-4-4 buffer, issue multiplications as the first 3 instructions
				if (fetchType == 4 && !isLast) {
					create(&SuperscalarInstructionInfo::IMUL_R, gen);
				}
				else {
					create(slot_4[gen.getByte() & 1], gen);
				}
				break;
			case 7:
				create(slot_7[gen.getByte() & 1], gen);
				break;
			case 8:
				create(slot_8[gen.getByte() & 1], gen);
				break;
			case 9:
				create(slot_9[gen.getByte() & 1], gen);
				break;
			case 10:
				create(slot_10, gen);
				break;
			default:
				UNREACHABLE;
			}
		}